

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.h
# Opt level: O2

void __thiscall
cxxopts::exceptions::option_already_exists::option_already_exists
          (option_already_exists *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Option ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&bStack_98,&local_38,option);
  std::operator+(&local_78,&bStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  std::operator+(&local_58,&local_78," already exists");
  specification::specification(&this->super_specification,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_specification).super_exception = &PTR__exception_00140118;
  return;
}

Assistant:

explicit option_already_exists(const std::string& option)
  : specification("Option " + LQUOTE + option + RQUOTE + " already exists")
  {
  }